

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O2

UChar * u_strncpy_63(UChar *dst,UChar *src,int32_t n)

{
  short sVar1;
  long lVar2;
  UChar *anchor;
  
  for (lVar2 = 0;
      (0 < n && (sVar1 = *(short *)((long)src + lVar2), *(short *)((long)dst + lVar2) = sVar1,
                sVar1 != 0)); lVar2 = lVar2 + 2) {
    n = n + -1;
  }
  return dst;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_strncpy(UChar     *dst, 
     const UChar     *src, 
     int32_t     n) 
{
    UChar *anchor = dst;            /* save a pointer to start of dst */

    /* copy string 2 over */
    while(n > 0 && (*(dst++) = *(src++)) != 0) {
        --n;
    }

    return anchor;
}